

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-semaphore.c
# Opt level: O0

int run_test_semaphore_2(void)

{
  int iVar1;
  undefined1 local_60 [8];
  worker_config_conflict1 wc;
  uv_thread_t thread;
  
  memset(local_60,0,0x50);
  wc.sem._24_4_ = 100;
  iVar1 = uv_sem_init((undefined1 *)((long)&wc.mutex + 0x20),0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-semaphore.c"
            ,0x51,"0 == uv_sem_init(&wc.sem, 0)");
    abort();
  }
  iVar1 = uv_mutex_init(local_60);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-semaphore.c"
            ,0x52,"0 == uv_mutex_init(&wc.mutex)");
    abort();
  }
  iVar1 = uv_thread_create(&wc.delay,worker,local_60);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-semaphore.c"
            ,0x53,"0 == uv_thread_create(&thread, worker, &wc)");
    abort();
  }
  uv_sem_wait((undefined1 *)((long)&wc.mutex + 0x20));
  iVar1 = uv_thread_join(&wc.delay);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-semaphore.c"
            ,0x57,"0 == uv_thread_join(&thread)");
    abort();
  }
  uv_mutex_destroy(local_60);
  uv_sem_destroy((undefined1 *)((long)&wc.mutex + 0x20));
  return 0;
}

Assistant:

TEST_IMPL(semaphore_2) {
  uv_thread_t thread;
  worker_config wc;

  memset(&wc, 0, sizeof(wc));
  wc.delay = 100;

  ASSERT(0 == uv_sem_init(&wc.sem, 0));
  ASSERT(0 == uv_mutex_init(&wc.mutex));
  ASSERT(0 == uv_thread_create(&thread, worker, &wc));

  uv_sem_wait(&wc.sem);

  ASSERT(0 == uv_thread_join(&thread));
  uv_mutex_destroy(&wc.mutex);
  uv_sem_destroy(&wc.sem);

  return 0;
}